

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::ProducerIPCService::RemoteProducer::RemoteProducer(RemoteProducer *this)

{
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  (this->super_Producer)._vptr_Producer = (_func_int **)&PTR__RemoteProducer_003c9fa8;
  (this->service_endpoint)._M_t.
  super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
  .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl = (ProducerEndpoint *)0x0
  ;
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  ipc::Deferred<perfetto::protos::gen::GetAsyncCommandResponse>::Deferred
            (&this->async_producer_commands,
             (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetAsyncCommandResponse>)>
              *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  this->send_setup_tracing_on_async_commands_bound = false;
  return;
}

Assistant:

ProducerIPCService::RemoteProducer::RemoteProducer() = default;